

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenubar.cpp
# Opt level: O1

void __thiscall
QMenuBar::initStyleOption(QMenuBar *this,QStyleOptionMenuItem *option,QAction *action)

{
  State *pSVar1;
  byte *pbVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  QIconPrivate *pQVar9;
  long lVar10;
  QWidgetData *pQVar11;
  QArrayData *pQVar12;
  char16_t *pcVar13;
  qsizetype qVar14;
  QIcon QVar15;
  char cVar16;
  bool bVar17;
  QPalette *pQVar18;
  QAction *pQVar19;
  long in_FS_OFFSET;
  QIcon moved;
  QIcon local_50;
  QIcon local_48;
  char16_t *pcStack_40;
  qsizetype local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (action == (QAction *)0x0 || option == (QStyleOptionMenuItem *)0x0) goto LAB_0046d674;
  lVar8 = *(long *)&(this->super_QWidget).field_0x8;
  pQVar18 = QWidget::palette(&this->super_QWidget);
  QPalette::operator=(&(option->super_QStyleOption).palette,pQVar18);
  (option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
  super_QFlagsStorage<QStyle::StateFlag>.i = 0;
  if ((((this->super_QWidget).data)->widget_attributes & 1) == 0) {
    cVar16 = QAction::isEnabled();
    if (cVar16 == '\0') goto LAB_0046d4fa;
    pSVar1 = &(option->super_QStyleOption).state;
    *(byte *)&(pSVar1->super_QFlagsStorageHelper<QStyle::StateFlag,_4>).
              super_QFlagsStorage<QStyle::StateFlag>.i =
         (byte)(pSVar1->super_QFlagsStorageHelper<QStyle::StateFlag,_4>).
               super_QFlagsStorage<QStyle::StateFlag>.i | 1;
  }
  else {
LAB_0046d4fa:
    (option->super_QStyleOption).palette.currentGroup = Disabled;
  }
  QFontMetrics::QFontMetrics((QFontMetrics *)&local_48,&((this->super_QWidget).data)->fnt);
  pQVar9 = *(QIconPrivate **)&(option->super_QStyleOption).fontMetrics;
  *(QIconPrivate **)&(option->super_QStyleOption).fontMetrics = local_48.d;
  local_48.d = pQVar9;
  QFontMetrics::~QFontMetrics((QFontMetrics *)&local_48);
  lVar10 = *(long *)(lVar8 + 0x288);
  if (((lVar10 != 0) && (*(int *)(lVar10 + 4) != 0)) && (*(long *)(lVar8 + 0x290) != 0)) {
    if ((lVar10 == 0) || (*(int *)(lVar10 + 4) == 0)) {
      pQVar19 = (QAction *)0x0;
    }
    else {
      pQVar19 = *(QAction **)(lVar8 + 0x290);
    }
    if (pQVar19 == action) {
      uVar3 = (option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
              super_QFlagsStorage<QStyle::StateFlag>.i;
      (option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
      super_QFlagsStorage<QStyle::StateFlag>.i = uVar3 | 0x8000;
      if (((*(byte *)(lVar8 + 0x2a0) & 1) != 0) && ((*(byte *)(lVar8 + 0x298) & 2) == 0)) {
        (option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
        super_QFlagsStorage<QStyle::StateFlag>.i = uVar3 | 0x8004;
      }
    }
  }
  bVar17 = QWidget::hasFocus(&this->super_QWidget);
  if ((bVar17) ||
     (((*(long *)(lVar8 + 0x288) != 0 && (*(int *)(*(long *)(lVar8 + 0x288) + 4) != 0)) &&
      (*(long *)(lVar8 + 0x290) != 0)))) {
    pbVar2 = (byte *)((long)&(option->super_QStyleOption).state.
                             super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                             super_QFlagsStorage<QStyle::StateFlag>.i + 1);
    *pbVar2 = *pbVar2 | 1;
  }
  pQVar11 = (this->super_QWidget).data;
  iVar4 = (pQVar11->crect).x2.m_i;
  iVar5 = (pQVar11->crect).y2.m_i;
  iVar6 = (pQVar11->crect).x1.m_i;
  iVar7 = (pQVar11->crect).y1.m_i;
  (option->menuRect).x1 = 0;
  (option->menuRect).y1 = 0;
  (option->menuRect).x2 = (Representation)(iVar4 - iVar6);
  (option->menuRect).y2 = (Representation)(iVar5 - iVar7);
  option->menuItemType = Normal;
  option->checkType = NotCheckable;
  QAction::text();
  pQVar12 = &((option->text).d.d)->super_QArrayData;
  pcVar13 = (option->text).d.ptr;
  (option->text).d.d = (Data *)local_48.d;
  (option->text).d.ptr = pcStack_40;
  qVar14 = (option->text).d.size;
  (option->text).d.size = local_38;
  local_48.d = (QIconPrivate *)pQVar12;
  pcStack_40 = pcVar13;
  local_38 = qVar14;
  if (pQVar12 != (QArrayData *)0x0) {
    LOCK();
    (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar12->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar12,2,0x10);
    }
  }
  QAction::icon();
  QVar15.d = local_50.d;
  local_50.d = (QIconPrivate *)0x0;
  local_48.d = (option->icon).d;
  (option->icon).d = QVar15.d;
  QIcon::~QIcon(&local_48);
  QIcon::~QIcon(&local_50);
LAB_0046d674:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMenuBar::initStyleOption(QStyleOptionMenuItem *option, const QAction *action) const
{
    if (!option || !action)
        return;
    Q_D(const QMenuBar);
    option->palette = palette();
    option->state = QStyle::State_None;
    if (isEnabled() && action->isEnabled())
        option->state |= QStyle::State_Enabled;
    else
        option->palette.setCurrentColorGroup(QPalette::Disabled);
    option->fontMetrics = fontMetrics();
    if (d->currentAction && d->currentAction == action) {
        option->state |= QStyle::State_Selected;
        if (d->popupState && !d->closePopupMode)
            option->state |= QStyle::State_Sunken;
    }
    if (hasFocus() || d->currentAction)
        option->state |= QStyle::State_HasFocus;
    option->menuRect = rect();
    option->menuItemType = QStyleOptionMenuItem::Normal;
    option->checkType = QStyleOptionMenuItem::NotCheckable;
    option->text = action->text();
    option->icon = action->icon();
}